

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_StringUtilities.h
# Opt level: O1

string * choc::text::trim(string *__return_storage_ptr__,string *text)

{
  size_type sVar1;
  size_type *psVar2;
  long lVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_30;
  size_type local_28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20;
  
  local_30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(text->_M_dataplus)._M_p;
  paVar4 = &text->field_2;
  if (local_30 == paVar4) {
    local_20._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_20._8_8_ = *(undefined8 *)((long)&text->field_2 + 8);
    local_30 = &local_20;
  }
  else {
    local_20._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  sVar1 = text->_M_string_length;
  (text->_M_dataplus)._M_p = (pointer)paVar4;
  text->_M_string_length = 0;
  (text->field_2)._M_local_buf[0] = '\0';
  if (sVar1 != 0) {
    psVar2 = &local_28;
    local_28 = sVar1;
    do {
      if ((4 < (byte)local_30->_M_local_buf[local_28 - 1] - 9) &&
         (local_30->_M_local_buf[local_28 - 1] != 0x20)) {
        local_30->_M_local_buf[local_28] = 0;
        local_50 = &local_40;
        if (local_30 == &local_20) {
          local_40._8_8_ = local_20._8_8_;
        }
        else {
          local_50 = local_30;
        }
        local_40._M_allocated_capacity = local_20._M_allocated_capacity;
        paVar4 = &local_20;
        local_48 = local_28;
        local_30 = &local_20;
        goto LAB_001df0bc;
      }
      local_28 = local_28 - 1;
    } while (local_28 != 0);
  }
  local_50 = &local_40;
  psVar2 = &local_48;
  paVar4 = local_50;
  local_28 = sVar1;
LAB_001df0bc:
  *psVar2 = 0;
  paVar4->_M_local_buf[0] = 0;
  if (local_48 != 0) {
    if ((4 < (byte)local_50->_M_local_buf[0] - 9) && (local_50->_M_local_buf[0] != 0x20)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      paVar4 = &local_40;
      if (local_50 == paVar4) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity = local_40._M_allocated_capacity;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_40._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_50;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = local_40._M_allocated_capacity;
      }
      psVar2 = &local_48;
      __return_storage_ptr__->_M_string_length = local_48;
      local_50 = paVar4;
      goto LAB_001df0f5;
    }
    if (local_48 != 1) {
      lVar3 = local_48 - 1;
      paVar4 = local_50;
      do {
        paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(paVar4->_M_local_buf + 1);
        if ((4 < (byte)paVar4->_M_local_buf[0] - 9) && (paVar4->_M_local_buf[0] != 0x20)) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                    ((string *)__return_storage_ptr__,paVar4,(byte *)((long)local_50 + local_48));
          goto LAB_001df0ff;
        }
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
  }
  paVar4 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar4;
  psVar2 = &__return_storage_ptr__->_M_string_length;
LAB_001df0f5:
  *psVar2 = 0;
  paVar4->_M_local_buf[0] = 0;
LAB_001df0ff:
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40._M_allocated_capacity + 1);
  }
  if (local_30 != &local_20) {
    operator_delete(local_30,local_20._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string      trim (std::string      text)    { return trimStart (trimEnd (std::move (text))); }